

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreeSearchPointPop(RtreeCursor *p)

{
  long lVar1;
  RtreeNode *pNode;
  RtreeSearchPoint *pRVar2;
  sqlite3_int64 sVar3;
  RtreeSearchPoint *pRVar4;
  u8 uVar5;
  u8 uVar6;
  undefined5 uVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int j;
  int iVar12;
  int iVar13;
  
  bVar8 = p->bPoint;
  pNode = *(RtreeNode **)((long)p + (1 - (ulong)bVar8) * 8 + 0x58);
  if (pNode != (RtreeNode *)0x0) {
    nodeRelease((Rtree *)(p->base).pVtab,pNode);
    *(undefined8 *)((long)p + (1 - (ulong)bVar8) * 8 + 0x58) = 0;
    bVar8 = p->bPoint;
  }
  if (bVar8 == 0) {
    iVar13 = p->nPoint;
    lVar10 = (long)iVar13;
    if (lVar10 != 0) {
      pRVar2 = p->aPoint;
      p->anQueue[pRVar2->iLevel] = p->anQueue[pRVar2->iLevel] - 1;
      lVar1 = lVar10 + -1;
      iVar11 = (int)lVar1;
      p->nPoint = iVar11;
      pRVar4 = pRVar2 + lVar1;
      uVar5 = pRVar4->eWithin;
      uVar6 = pRVar4->iCell;
      uVar7 = *(undefined5 *)&pRVar4->field_0x13;
      pRVar2->iLevel = pRVar4->iLevel;
      pRVar2->eWithin = uVar5;
      pRVar2->iCell = uVar6;
      *(undefined5 *)&pRVar2->field_0x13 = uVar7;
      sVar3 = pRVar2[lVar1].id;
      pRVar2->rScore = pRVar2[lVar1].rScore;
      pRVar2->id = sVar3;
      if (iVar13 < 5) {
        p->aNode[1] = p->aNode[lVar10];
        p->aNode[lVar10] = (RtreeNode *)0x0;
      }
      iVar13 = 0;
      while (j = iVar13 * 2 + 1, j < iVar11) {
        iVar12 = iVar13 * 2 + 2;
        pRVar2 = p->aPoint;
        if (iVar12 < iVar11) {
          iVar9 = rtreeSearchPointCompare(pRVar2 + iVar12,pRVar2 + j);
          if (-1 < iVar9) goto LAB_001b2264;
          iVar9 = rtreeSearchPointCompare(pRVar2 + iVar12,pRVar2 + iVar13);
          j = iVar12;
        }
        else {
LAB_001b2264:
          iVar9 = rtreeSearchPointCompare(pRVar2 + j,pRVar2 + iVar13);
        }
        if (-1 < iVar9) {
          return;
        }
        rtreeSearchPointSwap(p,iVar13,j);
        iVar13 = j;
      }
    }
  }
  else {
    p->anQueue[(p->sPoint).iLevel] = p->anQueue[(p->sPoint).iLevel] - 1;
    p->bPoint = '\0';
  }
  return;
}

Assistant:

static void rtreeSearchPointPop(RtreeCursor *p){
  int i, j, k, n;
  i = 1 - p->bPoint;
  assert( i==0 || i==1 );
  if( p->aNode[i] ){
    nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
    p->aNode[i] = 0;
  }
  if( p->bPoint ){
    p->anQueue[p->sPoint.iLevel]--;
    p->bPoint = 0;
  }else if( p->nPoint ){
    p->anQueue[p->aPoint[0].iLevel]--;
    n = --p->nPoint;
    p->aPoint[0] = p->aPoint[n];
    if( n<RTREE_CACHE_SZ-1 ){
      p->aNode[1] = p->aNode[n+1];
      p->aNode[n+1] = 0;
    }
    i = 0;
    while( (j = i*2+1)<n ){
      k = j+1;
      if( k<n && rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[j])<0 ){
        if( rtreeSearchPointCompare(&p->aPoint[k], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, k);
          i = k;
        }else{
          break;
        }
      }else{
        if( rtreeSearchPointCompare(&p->aPoint[j], &p->aPoint[i])<0 ){
          rtreeSearchPointSwap(p, i, j);
          i = j;
        }else{
          break;
        }
      }
    }
  }
}